

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O0

void __thiscall AllReduceSockets::broadcast(AllReduceSockets *this,char *buffer,size_t n)

{
  undefined8 uVar1;
  unsigned_long *puVar2;
  ssize_t sVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  int read_size;
  size_t count;
  stringstream __msg;
  size_t children_sent_pos;
  size_t parent_read_pos;
  size_t *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  vw_exception *in_stack_fffffffffffffe10;
  stringstream local_1b0 [16];
  ostream local_1a0;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_20 = 0;
  local_28 = 0;
  if (*(int *)((long)&in_RDI[1].field_2 + 8) == -1) {
    local_20 = in_RDX;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(int *)((long)&in_RDI[1].field_2 + 0xc) == -1) && (*(int *)(in_RDI + 2) == -1)) {
    local_28 = in_RDX;
  }
  while ((local_20 < local_18 || local_28 < local_18 &&
         ((pass_down((AllReduceSockets *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),(char *)in_RDI,
                     CONCAT17(local_20 < local_18 || local_28 < local_18,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffde8), local_20 < local_18 || (local_28 < local_18))))) {
    if (*(int *)((long)&in_RDI[1].field_2 + 8) != -1) {
      if (local_20 == local_18) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        std::operator<<(&local_1a0,"I think parent has no data to send but he thinks he has");
        uVar1 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                   in_RDI);
        __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      in_stack_fffffffffffffe08 = (char *)(local_18 - local_20);
      puVar2 = std::min<unsigned_long>(&ar_buf_size,(unsigned_long *)&stack0xfffffffffffffe08);
      in_stack_fffffffffffffe10 = (vw_exception *)*puVar2;
      sVar3 = recv(*(int *)((long)&in_RDI[1].field_2 + 8),(void *)(local_10 + local_20),
                   (long)(int)in_stack_fffffffffffffe10,0);
      in_stack_fffffffffffffe04 = (int)sVar3;
      if (in_stack_fffffffffffffe04 == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr," recv from parent: ");
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        poVar4 = std::operator<<(poVar4,pcVar6);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      local_20 = (long)in_stack_fffffffffffffe04 + local_20;
    }
  }
  return;
}

Assistant:

void AllReduceSockets::broadcast(char* buffer, const size_t n)
{
  size_t parent_read_pos = 0;    // First unread float from parent
  size_t children_sent_pos = 0;  // First unsent float to children
  // parent_sent_pos <= left_read_pos
  // parent_sent_pos <= right_read_pos

  if (socks.parent == -1)
  {
    parent_read_pos = n;
  }
  if (socks.children[0] == -1 && socks.children[1] == -1)
    children_sent_pos = n;

  while (parent_read_pos < n || children_sent_pos < n)
  {
    pass_down(buffer, parent_read_pos, children_sent_pos);
    if (parent_read_pos >= n && children_sent_pos >= n)
      break;

    if (socks.parent != -1)
    {
      // there is data to be read from the parent
      if (parent_read_pos == n)
        THROW("I think parent has no data to send but he thinks he has");

      size_t count = min(ar_buf_size, n - parent_read_pos);
      int read_size = recv(socks.parent, buffer + parent_read_pos, (int)count, 0);
      if (read_size == -1)
      {
        cerr << " recv from parent: " << strerror(errno) << endl;
      }
      parent_read_pos += read_size;
    }
  }
}